

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

ArgString * __thiscall
Potassco::ArgString::get<Potassco::Set<Clasp::HeuParams::DomPref>>
          (ArgString *this,Set<Clasp::HeuParams::DomPref> *x)

{
  bool bVar1;
  int iVar2;
  ArgString *in_RDI;
  char *next;
  int in_stack_0000002c;
  char **in_stack_00000030;
  Set<Clasp::HeuParams::DomPref> *in_stack_00000038;
  char *in_stack_00000040;
  char *local_28;
  
  bVar1 = ok(in_RDI);
  if (bVar1) {
    local_28 = in_RDI->in + (int)(uint)(*in_RDI->in == in_RDI->skip);
    iVar2 = xconvert<Clasp::HeuParams::DomPref>
                      (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    if (iVar2 == 0) {
      local_28 = (char *)0x0;
    }
    in_RDI->in = local_28;
    in_RDI->skip = ',';
  }
  return in_RDI;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}